

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

void __thiscall
helics::Input::Input
          (Input *this,ValueFederate *valueFed,InterfaceHandle id,string_view actName,
          string_view unitsOut)

{
  element_type *peVar1;
  uint64_t match_flags;
  shared_ptr<units::precise_unit> *this_00;
  Federate *federate;
  allocator<char> local_69;
  undefined1 local_68 [16];
  string local_58;
  precise_unit local_38;
  
  if (valueFed == (ValueFederate *)0x0) {
    federate = (Federate *)0x0;
  }
  else {
    federate = (Federate *)
               ((long)&valueFed->_vptr_ValueFederate + (long)valueFed->_vptr_ValueFederate[-3]);
  }
  Interface::Interface(&this->super_Interface,federate,id,(string_view)actName);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Input_0044cb00;
  this->fed = valueFed;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->targetType = HELICS_UNKNOWN;
  this->injectionType = HELICS_UNKNOWN;
  this->inputVectorOp = NO_OP;
  this->prevInputCount = 0;
  this->customTypeHash = 0;
  this->changeDetectionEnabled = false;
  this->hasUpdate = false;
  this->disableAssign = false;
  this->useThreshold = false;
  this->multiUnits = false;
  *(undefined8 *)
   &(this->lastValue).
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    .
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0xca1b5e7e08ca3a8f;
  *(__index_type *)
   ((long)&(this->lastValue).
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           .
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
   + 0x28) = '\0';
  (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sourceTypes).
  super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->givenTarget)._M_dataplus._M_p = (pointer)&(this->givenTarget).field_2;
  (this->givenTarget)._M_string_length = 0;
  (this->givenTarget).field_2._M_local_buf[0] = '\0';
  this->delta = -1.0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x11) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x19) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(this->value_callback).
           super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
           .
           super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
           .
           super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
   + 0x10) = 0;
  this->threshold = 0.0;
  *(undefined8 *)
   &(this->value_callback).
    super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
    .
    super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    .
    super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
    ._M_u = 0;
  if (unitsOut._M_len != 0) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_58,&unitsOut,&local_69);
    match_flags = ::units::getDefaultFlags();
    local_38 = ::units::unit_from_string(&local_58,match_flags);
    std::make_shared<units::precise_unit,units::precise_unit>((precise_unit *)local_68);
    this_00 = &this->outputUnits;
    std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    std::__cxx11::string::~string((string *)&local_58);
    peVar1 = (this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((NAN(peVar1->multiplier_)) && (peVar1->base_units_ == (unit_data)0xfa94a488)) {
      std::__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this_00->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

Input::Input(ValueFederate* valueFed,
             InterfaceHandle id,
             std::string_view actName,
             std::string_view unitsOut): Interface(valueFed, id, actName), fed(valueFed)
{
    if (!unitsOut.empty()) {
        outputUnits =
            std::make_shared<units::precise_unit>(units::unit_from_string(std::string{unitsOut}));
        if (!units::is_valid(*outputUnits)) {
            outputUnits.reset();
        }
    }
}